

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O2

double * __thiscall
cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse>::_mat
          (BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse> *this,uint label_i)

{
  mapped_type *pmVar1;
  Scalar *pSVar2;
  uint local_c;
  
  local_c = label_i;
  pmVar1 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&this->_label_to_idx,&local_c);
  pSVar2 = Eigen::SparseMatrix<double,_1,_int>::coeffRef
                     (&this->_quadmat,*pmVar1,(this->_quadmat).m_outerSize + -1);
  return pSVar2;
}

Assistant:

inline FloatType &_mat( IndexType label_i ) {
      size_t i = _label_to_idx.at( label_i );
      return _quadmat_get( i, _quadmat.rows() - 1 );
    }